

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_det_m(REF_DBL *m,REF_DBL *det)

{
  uint uVar1;
  REF_DBL a [9];
  REF_DBL local_58;
  REF_DBL local_50;
  REF_DBL local_48;
  REF_DBL local_40;
  REF_DBL local_38;
  REF_DBL local_30;
  REF_DBL local_28;
  REF_DBL local_20;
  REF_DBL local_18;
  
  local_58 = *m;
  local_50 = m[1];
  local_48 = m[2];
  local_38 = m[3];
  local_30 = m[4];
  local_18 = m[5];
  local_40 = local_50;
  local_28 = local_48;
  local_20 = local_30;
  uVar1 = ref_matrix_det_gen(3,&local_58,det);
  if (uVar1 == 0) {
    uVar1 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x47,
           "ref_matrix_det_m",(ulong)uVar1,"gen det");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_det_m(REF_DBL *m, REF_DBL *det) {
  REF_DBL a[9];
  RSS(ref_matrix_m_full(m, a), "full");

  RSS(ref_matrix_det_gen(3, a, det), "gen det");

  return REF_SUCCESS;
}